

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O2

size_t axl::io::getSockAddrNetMaskBitCount(sockaddr *addr)

{
  size_t sVar1;
  
  if (addr->sa_family == 10) {
    sVar1 = sl::findZeroBit((size_t *)(addr->sa_data + 6),2,0);
    if (0x7f < sVar1) {
      sVar1 = 0x80;
    }
    return sVar1;
  }
  if (addr->sa_family != 2) {
    return 0;
  }
  sVar1 = sl::findZeroBit((size_t *)(addr->sa_data + 2),1,0);
  if (0x1f < sVar1) {
    sVar1 = 0x20;
  }
  return sVar1;
}

Assistant:

size_t
getSockAddrNetMaskBitCount(const sockaddr* addr) {
	switch (addr->sa_family) {
	case AF_INET:
		return getSockAddrNetMaskBitCount_ip4((const sockaddr_in*)addr);

	case AF_INET6:
		return getSockAddrNetMaskBitCount_ip6((const sockaddr_in6*)addr);

	default:
		return 0;
	}
}